

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConcurrentAssertionStatementSyntax *pCVar1;
  NamedLabelSyntax **unaff_RBX;
  SyntaxKind *unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  Token *in_stack_00000030;
  PropertySpecSyntax *in_stack_00000038;
  Token *in_stack_00000040;
  ActionBlockSyntax *in_stack_00000048;
  BumpAllocator *in_stack_000000a8;
  Token *in_stack_000000b0;
  BumpAllocator *in_stack_ffffffffffffff58;
  NamedLabelSyntax *in_stack_ffffffffffffff60;
  NamedLabelSyntax *local_78;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_78 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_78 = deepClone<slang::syntax::NamedLabelSyntax>
                         (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000010,in_stack_00000008);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  not_null<slang::syntax::PropertySpecSyntax_*>::operator*
            ((not_null<slang::syntax::PropertySpecSyntax_*> *)0xa2cb95);
  deepClone<slang::syntax::PropertySpecSyntax>
            ((PropertySpecSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  not_null<slang::syntax::ActionBlockSyntax_*>::operator*
            ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xa2cbe4);
  deepClone<slang::syntax::ActionBlockSyntax>
            ((ActionBlockSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConcurrentAssertionStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertySpecSyntax&,slang::parsing::Token,slang::syntax::ActionBlockSyntax&>
                     (in_stack_00000008,unaff_retaddr,unaff_RBX,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(Token *)local_78,in_stack_00000030,in_stack_00000038,
                      in_stack_00000040,in_stack_00000048);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConcurrentAssertionStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConcurrentAssertionStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.propertyOrSequence.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<PropertySpecSyntax>(*node.propertySpec, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<ActionBlockSyntax>(*node.action, alloc)
    );
}